

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

void re2c::output_state_goto(ostream *o,uint32_t ind,uint32_t start_label)

{
  ostream *poVar1;
  opt_t *poVar2;
  uint32_t ind_00;
  uint32_t ind_01;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t ind_02;
  uint32_t extraout_EDX_01;
  string local_110;
  string local_f0;
  uint local_cc;
  undefined1 local_c8 [4];
  uint32_t i;
  string local_a8;
  string local_88;
  string local_68 [48];
  string local_38;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t start_label_local;
  uint32_t ind_local;
  ostream *o_local;
  
  local_18 = start_label;
  local_14 = ind;
  _start_label_local = o;
  indent_abi_cxx11_(&local_38,(re2c *)(ulong)ind,start_label);
  poVar1 = std::operator<<(o,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"switch (");
  output_get_state_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_68);
  std::operator<<(poVar1,") {\n");
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&local_38);
  poVar2 = Opt::operator->((Opt *)&opts);
  poVar1 = _start_label_local;
  if ((poVar2->bUseStateAbort & 1U) == 0) {
    indent_abi_cxx11_((string *)local_c8,(re2c *)(ulong)local_14,ind_00);
    poVar1 = std::operator<<(poVar1,(string *)local_c8);
    poVar1 = std::operator<<(poVar1,"default: goto ");
    poVar2 = Opt::operator->((Opt *)&opts);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->labelPrefix);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::operator<<(poVar1,";\n");
    std::__cxx11::string::~string((string *)local_c8);
    ind_02 = extraout_EDX_00;
  }
  else {
    indent_abi_cxx11_(&local_88,(re2c *)(ulong)local_14,ind_00);
    poVar1 = std::operator<<(poVar1,(string *)&local_88);
    std::operator<<(poVar1,"default: abort();\n");
    std::__cxx11::string::~string((string *)&local_88);
    poVar1 = _start_label_local;
    indent_abi_cxx11_(&local_a8,(re2c *)(ulong)local_14,ind_01);
    poVar1 = std::operator<<(poVar1,(string *)&local_a8);
    poVar1 = std::operator<<(poVar1,"case -1: goto ");
    poVar2 = Opt::operator->((Opt *)&opts);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->labelPrefix);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::operator<<(poVar1,";\n");
    std::__cxx11::string::~string((string *)&local_a8);
    ind_02 = extraout_EDX;
  }
  for (local_cc = 0; poVar1 = _start_label_local, local_cc < last_fill_index;
      local_cc = local_cc + 1) {
    indent_abi_cxx11_(&local_f0,(re2c *)(ulong)local_14,ind_02);
    poVar1 = std::operator<<(poVar1,(string *)&local_f0);
    poVar1 = std::operator<<(poVar1,"case ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_cc);
    poVar1 = std::operator<<(poVar1,": goto ");
    poVar2 = Opt::operator->((Opt *)&opts);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->yyfilllabel);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_cc);
    std::operator<<(poVar1,";\n");
    std::__cxx11::string::~string((string *)&local_f0);
    ind_02 = extraout_EDX_01;
  }
  indent_abi_cxx11_(&local_110,(re2c *)(ulong)local_14,ind_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_110);
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::~string((string *)&local_110);
  poVar2 = Opt::operator->((Opt *)&opts);
  poVar1 = _start_label_local;
  if ((poVar2->bUseStateNext & 1U) != 0) {
    poVar2 = Opt::operator->((Opt *)&opts);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->yynext);
    std::operator<<(poVar1,":\n");
  }
  return;
}

Assistant:

void output_state_goto (std::ostream & o, uint32_t ind, uint32_t start_label)
{
	o << indent(ind) << "switch (" << output_get_state() << ") {\n";
	if (opts->bUseStateAbort)
	{
		o << indent(ind) << "default: abort();\n";
		o << indent(ind) << "case -1: goto " << opts->labelPrefix << start_label << ";\n";
	}
	else
	{
		o << indent(ind) << "default: goto " << opts->labelPrefix << start_label << ";\n";
	}
	for (uint32_t i = 0; i < last_fill_index; ++i)
	{
		o << indent(ind) << "case " << i << ": goto " << opts->yyfilllabel << i << ";\n";
	}
	o << indent(ind) << "}\n";
	if (opts->bUseStateNext)
	{
		o << opts->yynext << ":\n";
	}
}